

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_ringbuffer.h
# Opt level: O3

int __thiscall
ring_buffer_base<cubeb_log_message>::dequeue
          (ring_buffer_base<cubeb_log_message> *this,cubeb_log_message *elements,int count)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  cubeb_log_message *pcVar5;
  long lVar6;
  int iVar7;
  
  iVar1 = (this->write_index_).super___atomic_base<int>._M_i;
  iVar2 = (this->read_index_).super___atomic_base<int>._M_i;
  iVar7 = 0;
  if (iVar1 != iVar2) {
    iVar3 = 0;
    if (iVar1 < iVar2) {
      iVar3 = this->capacity_;
    }
    iVar3 = (iVar1 - iVar2) + iVar3;
    iVar7 = count;
    if (iVar3 < count) {
      iVar7 = iVar3;
    }
    if (elements != (cubeb_log_message *)0x0) {
      iVar3 = this->capacity_ - iVar2;
      iVar1 = iVar3;
      if (iVar7 < iVar3) {
        iVar1 = iVar7;
      }
      pcVar5 = (this->data_)._M_t.
               super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>.
               _M_t.
               super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>
               .super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl;
      if (iVar1 != 0) {
        lVar6 = 0;
        lVar4 = (long)iVar1;
        do {
          memcpy(elements->storage + lVar6,pcVar5[iVar2].storage + lVar6,0x100);
          lVar6 = lVar6 + 0x100;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        pcVar5 = (this->data_)._M_t.
                 super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>
                 .super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl;
      }
      if (iVar3 < iVar7) {
        lVar6 = (long)(iVar7 - iVar1);
        lVar4 = 0;
        do {
          memcpy(elements[iVar1].storage + lVar4,pcVar5->storage + lVar4,0x100);
          lVar4 = lVar4 + 0x100;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
    }
    (this->read_index_).super___atomic_base<int>._M_i = (iVar2 + iVar7) % this->capacity_;
  }
  return iVar7;
}

Assistant:

int dequeue(T * elements, int count)
  {
#ifndef NDEBUG
    assert_correct_thread(consumer_id);
#endif

    int wr_idx = write_index_.load(std::memory_order_acquire);
    int rd_idx = read_index_.load(std::memory_order_relaxed);

    if (empty_internal(rd_idx, wr_idx)) {
      return 0;
    }

    int to_read = std::min(available_read_internal(rd_idx, wr_idx), count);

    int first_part = std::min(storage_capacity() - rd_idx, to_read);
    int second_part = to_read - first_part;

    if (elements) {
      Copy(elements, data_.get() + rd_idx, first_part);
      Copy(elements + first_part, data_.get(), second_part);
    }

    read_index_.store(increment_index(rd_idx, to_read),
                      std::memory_order_relaxed);

    return to_read;
  }